

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_ecb(ptls_cipher_algorithm_t *algo,void *expected,size_t expected_len)

{
  undefined1 (*__ptr) [16];
  ptls_cipher_context_t *ppVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  __ptr = (undefined1 (*) [16])calloc(1,0x10);
  if (__ptr != (undefined1 (*) [16])0x0) {
    ppVar1 = ptls_cipher_new(algo,1,"");
    (*ppVar1->do_transform)(ppVar1,__ptr,"",0x10);
    (*ppVar1->do_dispose)(ppVar1);
    free(ppVar1);
    auVar2 = *__ptr;
    auVar3[0] = -(*expected == auVar2[0]);
    auVar3[1] = -(*(char *)((long)expected + 1) == auVar2[1]);
    auVar3[2] = -(*(char *)((long)expected + 2) == auVar2[2]);
    auVar3[3] = -(*(char *)((long)expected + 3) == auVar2[3]);
    auVar3[4] = -(*(char *)((long)expected + 4) == auVar2[4]);
    auVar3[5] = -(*(char *)((long)expected + 5) == auVar2[5]);
    auVar3[6] = -(*(char *)((long)expected + 6) == auVar2[6]);
    auVar3[7] = -(*(char *)((long)expected + 7) == auVar2[7]);
    auVar3[8] = -(*(char *)((long)expected + 8) == auVar2[8]);
    auVar3[9] = -(*(char *)((long)expected + 9) == auVar2[9]);
    auVar3[10] = -(*(char *)((long)expected + 10) == auVar2[10]);
    auVar3[0xb] = -(*(char *)((long)expected + 0xb) == auVar2[0xb]);
    auVar3[0xc] = -(*(char *)((long)expected + 0xc) == auVar2[0xc]);
    auVar3[0xd] = -(*(char *)((long)expected + 0xd) == auVar2[0xd]);
    auVar3[0xe] = -(*(char *)((long)expected + 0xe) == auVar2[0xe]);
    auVar3[0xf] = -(*(char *)((long)expected + 0xf) == auVar2[0xf]);
    _ok((uint)((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xd1);
    ppVar1 = ptls_cipher_new(algo,0,"");
    (*ppVar1->do_transform)(ppVar1,__ptr,__ptr,0x10);
    (*ppVar1->do_dispose)(ppVar1);
    free(ppVar1);
    auVar2[0] = -((*__ptr)[0] == '\0');
    auVar2[1] = -((*__ptr)[1] == '\x11');
    auVar2[2] = -((*__ptr)[2] == '\"');
    auVar2[3] = -((*__ptr)[3] == '3');
    auVar2[4] = -((*__ptr)[4] == 'D');
    auVar2[5] = -((*__ptr)[5] == 'U');
    auVar2[6] = -((*__ptr)[6] == 'f');
    auVar2[7] = -((*__ptr)[7] == 'w');
    auVar2[8] = -((*__ptr)[8] == -0x78);
    auVar2[9] = -((*__ptr)[9] == -0x67);
    auVar2[10] = -((*__ptr)[10] == -0x56);
    auVar2[0xb] = -((*__ptr)[0xb] == -0x45);
    auVar2[0xc] = -((*__ptr)[0xc] == -0x34);
    auVar2[0xd] = -((*__ptr)[0xd] == -0x23);
    auVar2[0xe] = -((*__ptr)[0xe] == -0x12);
    auVar2[0xf] = -((*__ptr)[0xf] == -1);
    _ok((uint)((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar2[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xd7);
    free(__ptr);
    return;
  }
  __assert_fail("actual != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                0xcb,"void test_ecb(ptls_cipher_algorithm_t *, const void *, size_t)");
}

Assistant:

static void test_ecb(ptls_cipher_algorithm_t *algo, const void *expected, size_t expected_len)
{
    static const uint8_t key[] = {0,  1,  2,  3,  4,  5,  6,  7,  8,  9,  10, 11, 12, 13, 14, 15,
                                  16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30, 31},
                         plaintext[] = {0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77,
                                        0x88, 0x99, 0xaa, 0xbb, 0xcc, 0xdd, 0xee, 0xff};

    uint8_t *actual = malloc(expected_len);
    assert(actual != NULL);
    /* encrypt */
    memset(actual, 0, expected_len);
    ptls_cipher_context_t *ctx = ptls_cipher_new(algo, 1, key);
    ptls_cipher_encrypt(ctx, actual, plaintext, expected_len);
    ptls_cipher_free(ctx);
    ok(memcmp(actual, expected, expected_len) == 0);

    /* decrypt */
    ctx = ptls_cipher_new(algo, 0, key);
    ptls_cipher_encrypt(ctx, actual, actual, expected_len);
    ptls_cipher_free(ctx);
    ok(memcmp(actual, plaintext, expected_len) == 0);

    free(actual);
}